

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

type fmt::v5::format_to_n<char*,char[5],char[7]>
               (char *out,size_t n,char (*format_str) [5],char (*args) [7])

{
  basic_string_view<char> format_str_00;
  type tVar1;
  type args_00;
  format_arg_store<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char[7]>
  as;
  char (*local_28 [2]) [7];
  
  local_28[0] = args;
  format_str_00 = to_string_view<char>(*format_str);
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
        *)local_28;
  args_00.types_ =
       format_arg_store<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>,char[7]>
       ::TYPES;
  tVar1 = vformat_to_n<char*,char>(out,n,format_str_00,args_00);
  return tVar1;
}

Assistant:

format_to_n(OutputIt out, std::size_t n, const S &format_str,
                const Args &... args) {
  internal::check_format_string<Args...>(format_str);
  typedef FMT_CHAR(S) Char;
  format_arg_store<
      typename format_to_n_context<OutputIt, Char>::type, Args...> as(args...);
  return vformat_to_n(out, n, to_string_view(format_str),
                      typename format_to_n_args<OutputIt, Char>::type(as));
}